

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O3

uint __thiscall test_app::cache_size(test_app *this)

{
  char cVar1;
  uint *puVar2;
  ostream *poVar3;
  runtime_error *this_00;
  uint keys;
  uint triggers;
  ostringstream oss;
  uint local_1b8 [2];
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  puVar2 = (uint *)cppcms::application::cache();
  cVar1 = cppcms::cache_interface::stats(puVar2,local_1b8);
  if (cVar1 != '\0') {
    return local_1b8[0];
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x144);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," cache().stats(keys,triggers)",0x1d);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unsigned cache_size()
	{
		unsigned keys,triggers;
		TEST(cache().stats(keys,triggers));
		return keys;
	}